

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

fullpath_ref_t GetInputFile(char **p)

{
  fullpath_ref_t pSVar1;
  delim_string_t name_in;
  delim_string_t local_30;
  
  GetDelimitedStringEx_abi_cxx11_(&local_30,p);
  pSVar1 = GetInputFile(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.first._M_dataplus._M_p != &local_30.first.field_2) {
    operator_delete(local_30.first._M_dataplus._M_p,local_30.first.field_2._M_allocated_capacity + 1
                   );
  }
  return pSVar1;
}

Assistant:

fullpath_ref_t GetInputFile(char*& p) {
	auto name_in = GetDelimitedStringEx(p);
	return GetInputFile(std::move(name_in));
}